

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O1

StringRef llvm::dwarf::OperationEncodingString(uint Encoding)

{
  char *pcVar1;
  size_t sVar2;
  StringRef SVar3;
  
  sVar2 = 0;
  pcVar1 = (char *)0x0;
  switch(Encoding) {
  case 3:
    sVar2 = 10;
    pcVar1 = "DW_OP_addr";
    break;
  case 4:
  case 5:
  case 7:
  case 0xaa:
  case 0xab:
  case 0xac:
  case 0xad:
  case 0xae:
  case 0xaf:
  case 0xb0:
  case 0xb1:
  case 0xb2:
  case 0xb3:
  case 0xb4:
  case 0xb5:
  case 0xb6:
  case 0xb7:
  case 0xb8:
  case 0xb9:
  case 0xba:
  case 0xbb:
  case 0xbc:
  case 0xbd:
  case 0xbe:
  case 0xbf:
  case 0xc0:
  case 0xc1:
  case 0xc2:
  case 0xc3:
  case 0xc4:
  case 0xc5:
  case 0xc6:
  case 199:
  case 200:
  case 0xc9:
  case 0xca:
  case 0xcb:
  case 0xcc:
  case 0xcd:
  case 0xce:
  case 0xcf:
  case 0xd0:
  case 0xd1:
  case 0xd2:
  case 0xd3:
  case 0xd4:
  case 0xd5:
  case 0xd6:
  case 0xd7:
  case 0xd8:
  case 0xd9:
  case 0xda:
  case 0xdb:
  case 0xdc:
  case 0xdd:
  case 0xde:
  case 0xdf:
  case 0xe1:
  case 0xe2:
  case 0xe3:
  case 0xe4:
  case 0xe5:
  case 0xe6:
  case 0xe7:
  case 0xe8:
  case 0xe9:
  case 0xea:
  case 0xeb:
  case 0xec:
  case 0xee:
  case 0xef:
  case 0xf0:
  case 0xf1:
  case 0xf2:
  case 0xf4:
  case 0xf5:
  case 0xf6:
  case 0xf7:
  case 0xf8:
  case 0xf9:
  case 0xfa:
    break;
  case 6:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_deref";
    break;
  case 8:
    sVar2 = 0xd;
    pcVar1 = "DW_OP_const1u";
    break;
  case 9:
    sVar2 = 0xd;
    pcVar1 = "DW_OP_const1s";
    break;
  case 10:
    sVar2 = 0xd;
    pcVar1 = "DW_OP_const2u";
    break;
  case 0xb:
    sVar2 = 0xd;
    pcVar1 = "DW_OP_const2s";
    break;
  case 0xc:
    sVar2 = 0xd;
    pcVar1 = "DW_OP_const4u";
    break;
  case 0xd:
    sVar2 = 0xd;
    pcVar1 = "DW_OP_const4s";
    break;
  case 0xe:
    sVar2 = 0xd;
    pcVar1 = "DW_OP_const8u";
    break;
  case 0xf:
    sVar2 = 0xd;
    pcVar1 = "DW_OP_const8s";
    break;
  case 0x10:
    sVar2 = 0xc;
    pcVar1 = "DW_OP_constu";
    break;
  case 0x11:
    sVar2 = 0xc;
    pcVar1 = "DW_OP_consts";
    break;
  case 0x12:
    sVar2 = 9;
    pcVar1 = "DW_OP_dup";
    break;
  case 0x13:
    sVar2 = 10;
    pcVar1 = "DW_OP_drop";
    break;
  case 0x14:
    sVar2 = 10;
    pcVar1 = "DW_OP_over";
    break;
  case 0x15:
    sVar2 = 10;
    pcVar1 = "DW_OP_pick";
    break;
  case 0x16:
    sVar2 = 10;
    pcVar1 = "DW_OP_swap";
    break;
  case 0x17:
    sVar2 = 9;
    pcVar1 = "DW_OP_rot";
    break;
  case 0x18:
    sVar2 = 0xc;
    pcVar1 = "DW_OP_xderef";
    break;
  case 0x19:
    sVar2 = 9;
    pcVar1 = "DW_OP_abs";
    break;
  case 0x1a:
    sVar2 = 9;
    pcVar1 = "DW_OP_and";
    break;
  case 0x1b:
    sVar2 = 9;
    pcVar1 = "DW_OP_div";
    break;
  case 0x1c:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_minus";
    break;
  case 0x1d:
    sVar2 = 9;
    pcVar1 = "DW_OP_mod";
    break;
  case 0x1e:
    sVar2 = 9;
    pcVar1 = "DW_OP_mul";
    break;
  case 0x1f:
    sVar2 = 9;
    pcVar1 = "DW_OP_neg";
    break;
  case 0x20:
    sVar2 = 9;
    pcVar1 = "DW_OP_not";
    break;
  case 0x21:
    sVar2 = 8;
    pcVar1 = "DW_OP_or";
    break;
  case 0x22:
    sVar2 = 10;
    pcVar1 = "DW_OP_plus";
    break;
  case 0x23:
    sVar2 = 0x11;
    pcVar1 = "DW_OP_plus_uconst";
    break;
  case 0x24:
    sVar2 = 9;
    pcVar1 = "DW_OP_shl";
    break;
  case 0x25:
    sVar2 = 9;
    pcVar1 = "DW_OP_shr";
    break;
  case 0x26:
    sVar2 = 10;
    pcVar1 = "DW_OP_shra";
    break;
  case 0x27:
    sVar2 = 9;
    pcVar1 = "DW_OP_xor";
    break;
  case 0x28:
    sVar2 = 9;
    pcVar1 = "DW_OP_bra";
    break;
  case 0x29:
    sVar2 = 8;
    pcVar1 = "DW_OP_eq";
    break;
  case 0x2a:
    sVar2 = 8;
    pcVar1 = "DW_OP_ge";
    break;
  case 0x2b:
    sVar2 = 8;
    pcVar1 = "DW_OP_gt";
    break;
  case 0x2c:
    sVar2 = 8;
    pcVar1 = "DW_OP_le";
    break;
  case 0x2d:
    sVar2 = 8;
    pcVar1 = "DW_OP_lt";
    break;
  case 0x2e:
    sVar2 = 8;
    pcVar1 = "DW_OP_ne";
    break;
  case 0x2f:
    sVar2 = 10;
    pcVar1 = "DW_OP_skip";
    break;
  case 0x30:
    sVar2 = 10;
    pcVar1 = "DW_OP_lit0";
    break;
  case 0x31:
    sVar2 = 10;
    pcVar1 = "DW_OP_lit1";
    break;
  case 0x32:
    sVar2 = 10;
    pcVar1 = "DW_OP_lit2";
    break;
  case 0x33:
    sVar2 = 10;
    pcVar1 = "DW_OP_lit3";
    break;
  case 0x34:
    sVar2 = 10;
    pcVar1 = "DW_OP_lit4";
    break;
  case 0x35:
    sVar2 = 10;
    pcVar1 = "DW_OP_lit5";
    break;
  case 0x36:
    sVar2 = 10;
    pcVar1 = "DW_OP_lit6";
    break;
  case 0x37:
    sVar2 = 10;
    pcVar1 = "DW_OP_lit7";
    break;
  case 0x38:
    sVar2 = 10;
    pcVar1 = "DW_OP_lit8";
    break;
  case 0x39:
    sVar2 = 10;
    pcVar1 = "DW_OP_lit9";
    break;
  case 0x3a:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_lit10";
    break;
  case 0x3b:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_lit11";
    break;
  case 0x3c:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_lit12";
    break;
  case 0x3d:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_lit13";
    break;
  case 0x3e:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_lit14";
    break;
  case 0x3f:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_lit15";
    break;
  case 0x40:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_lit16";
    break;
  case 0x41:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_lit17";
    break;
  case 0x42:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_lit18";
    break;
  case 0x43:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_lit19";
    break;
  case 0x44:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_lit20";
    break;
  case 0x45:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_lit21";
    break;
  case 0x46:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_lit22";
    break;
  case 0x47:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_lit23";
    break;
  case 0x48:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_lit24";
    break;
  case 0x49:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_lit25";
    break;
  case 0x4a:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_lit26";
    break;
  case 0x4b:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_lit27";
    break;
  case 0x4c:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_lit28";
    break;
  case 0x4d:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_lit29";
    break;
  case 0x4e:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_lit30";
    break;
  case 0x4f:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_lit31";
    break;
  case 0x50:
    sVar2 = 10;
    pcVar1 = "DW_OP_reg0";
    break;
  case 0x51:
    sVar2 = 10;
    pcVar1 = "DW_OP_reg1";
    break;
  case 0x52:
    sVar2 = 10;
    pcVar1 = "DW_OP_reg2";
    break;
  case 0x53:
    sVar2 = 10;
    pcVar1 = "DW_OP_reg3";
    break;
  case 0x54:
    sVar2 = 10;
    pcVar1 = "DW_OP_reg4";
    break;
  case 0x55:
    sVar2 = 10;
    pcVar1 = "DW_OP_reg5";
    break;
  case 0x56:
    sVar2 = 10;
    pcVar1 = "DW_OP_reg6";
    break;
  case 0x57:
    sVar2 = 10;
    pcVar1 = "DW_OP_reg7";
    break;
  case 0x58:
    sVar2 = 10;
    pcVar1 = "DW_OP_reg8";
    break;
  case 0x59:
    sVar2 = 10;
    pcVar1 = "DW_OP_reg9";
    break;
  case 0x5a:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_reg10";
    break;
  case 0x5b:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_reg11";
    break;
  case 0x5c:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_reg12";
    break;
  case 0x5d:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_reg13";
    break;
  case 0x5e:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_reg14";
    break;
  case 0x5f:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_reg15";
    break;
  case 0x60:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_reg16";
    break;
  case 0x61:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_reg17";
    break;
  case 0x62:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_reg18";
    break;
  case 99:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_reg19";
    break;
  case 100:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_reg20";
    break;
  case 0x65:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_reg21";
    break;
  case 0x66:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_reg22";
    break;
  case 0x67:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_reg23";
    break;
  case 0x68:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_reg24";
    break;
  case 0x69:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_reg25";
    break;
  case 0x6a:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_reg26";
    break;
  case 0x6b:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_reg27";
    break;
  case 0x6c:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_reg28";
    break;
  case 0x6d:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_reg29";
    break;
  case 0x6e:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_reg30";
    break;
  case 0x6f:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_reg31";
    break;
  case 0x70:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_breg0";
    break;
  case 0x71:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_breg1";
    break;
  case 0x72:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_breg2";
    break;
  case 0x73:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_breg3";
    break;
  case 0x74:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_breg4";
    break;
  case 0x75:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_breg5";
    break;
  case 0x76:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_breg6";
    break;
  case 0x77:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_breg7";
    break;
  case 0x78:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_breg8";
    break;
  case 0x79:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_breg9";
    break;
  case 0x7a:
    sVar2 = 0xc;
    pcVar1 = "DW_OP_breg10";
    break;
  case 0x7b:
    sVar2 = 0xc;
    pcVar1 = "DW_OP_breg11";
    break;
  case 0x7c:
    sVar2 = 0xc;
    pcVar1 = "DW_OP_breg12";
    break;
  case 0x7d:
    sVar2 = 0xc;
    pcVar1 = "DW_OP_breg13";
    break;
  case 0x7e:
    sVar2 = 0xc;
    pcVar1 = "DW_OP_breg14";
    break;
  case 0x7f:
    sVar2 = 0xc;
    pcVar1 = "DW_OP_breg15";
    break;
  case 0x80:
    sVar2 = 0xc;
    pcVar1 = "DW_OP_breg16";
    break;
  case 0x81:
    sVar2 = 0xc;
    pcVar1 = "DW_OP_breg17";
    break;
  case 0x82:
    sVar2 = 0xc;
    pcVar1 = "DW_OP_breg18";
    break;
  case 0x83:
    sVar2 = 0xc;
    pcVar1 = "DW_OP_breg19";
    break;
  case 0x84:
    sVar2 = 0xc;
    pcVar1 = "DW_OP_breg20";
    break;
  case 0x85:
    sVar2 = 0xc;
    pcVar1 = "DW_OP_breg21";
    break;
  case 0x86:
    sVar2 = 0xc;
    pcVar1 = "DW_OP_breg22";
    break;
  case 0x87:
    sVar2 = 0xc;
    pcVar1 = "DW_OP_breg23";
    break;
  case 0x88:
    sVar2 = 0xc;
    pcVar1 = "DW_OP_breg24";
    break;
  case 0x89:
    sVar2 = 0xc;
    pcVar1 = "DW_OP_breg25";
    break;
  case 0x8a:
    sVar2 = 0xc;
    pcVar1 = "DW_OP_breg26";
    break;
  case 0x8b:
    sVar2 = 0xc;
    pcVar1 = "DW_OP_breg27";
    break;
  case 0x8c:
    sVar2 = 0xc;
    pcVar1 = "DW_OP_breg28";
    break;
  case 0x8d:
    sVar2 = 0xc;
    pcVar1 = "DW_OP_breg29";
    break;
  case 0x8e:
    sVar2 = 0xc;
    pcVar1 = "DW_OP_breg30";
    break;
  case 0x8f:
    sVar2 = 0xc;
    pcVar1 = "DW_OP_breg31";
    break;
  case 0x90:
    sVar2 = 10;
    pcVar1 = "DW_OP_regx";
    break;
  case 0x91:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_fbreg";
    break;
  case 0x92:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_bregx";
    break;
  case 0x93:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_piece";
    break;
  case 0x94:
    sVar2 = 0x10;
    pcVar1 = "DW_OP_deref_size";
    break;
  case 0x95:
    sVar2 = 0x11;
    pcVar1 = "DW_OP_xderef_size";
    break;
  case 0x96:
    sVar2 = 9;
    pcVar1 = "DW_OP_nop";
    break;
  case 0x97:
    sVar2 = 0x19;
    pcVar1 = "DW_OP_push_object_address";
    break;
  case 0x98:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_call2";
    break;
  case 0x99:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_call4";
    break;
  case 0x9a:
    sVar2 = 0xe;
    pcVar1 = "DW_OP_call_ref";
    break;
  case 0x9b:
    sVar2 = 0x16;
    pcVar1 = "DW_OP_form_tls_address";
    break;
  case 0x9c:
    sVar2 = 0x14;
    pcVar1 = "DW_OP_call_frame_cfa";
    break;
  case 0x9d:
    sVar2 = 0xf;
    pcVar1 = "DW_OP_bit_piece";
    break;
  case 0x9e:
    sVar2 = 0x14;
    pcVar1 = "DW_OP_implicit_value";
    break;
  case 0x9f:
    sVar2 = 0x11;
    pcVar1 = "DW_OP_stack_value";
    break;
  case 0xa0:
    sVar2 = 0x16;
    pcVar1 = "DW_OP_implicit_pointer";
    break;
  case 0xa1:
    sVar2 = 0xb;
    pcVar1 = "DW_OP_addrx";
    break;
  case 0xa2:
    sVar2 = 0xc;
    pcVar1 = "DW_OP_constx";
    break;
  case 0xa3:
    sVar2 = 0x11;
    pcVar1 = "DW_OP_entry_value";
    break;
  case 0xa4:
    sVar2 = 0x10;
    pcVar1 = "DW_OP_const_type";
    break;
  case 0xa5:
    sVar2 = 0x11;
    pcVar1 = "DW_OP_regval_type";
    break;
  case 0xa6:
    sVar2 = 0x10;
    pcVar1 = "DW_OP_deref_type";
    break;
  case 0xa7:
    sVar2 = 0x11;
    pcVar1 = "DW_OP_xderef_type";
    break;
  case 0xa8:
    sVar2 = 0xd;
    pcVar1 = "DW_OP_convert";
    break;
  case 0xa9:
    sVar2 = 0x11;
    pcVar1 = "DW_OP_reinterpret";
    break;
  case 0xe0:
    sVar2 = 0x1a;
    pcVar1 = "DW_OP_GNU_push_tls_address";
    break;
  case 0xed:
    sVar2 = 0x13;
    pcVar1 = "DW_OP_WASM_location";
    break;
  case 0xf3:
    sVar2 = 0x15;
    pcVar1 = "DW_OP_GNU_entry_value";
    break;
  case 0xfb:
    sVar2 = 0x14;
    pcVar1 = "DW_OP_GNU_addr_index";
    break;
  case 0xfc:
    sVar2 = 0x15;
    pcVar1 = "DW_OP_GNU_const_index";
    break;
  default:
    switch(Encoding) {
    case 0x1000:
      sVar2 = 0x13;
      pcVar1 = "DW_OP_LLVM_fragment";
      break;
    case 0x1001:
      sVar2 = 0x12;
      pcVar1 = "DW_OP_LLVM_convert";
      break;
    case 0x1002:
      sVar2 = 0x15;
      pcVar1 = "DW_OP_LLVM_tag_offset";
      break;
    case 0x1003:
      sVar2 = 0x16;
      pcVar1 = "DW_OP_LLVM_entry_value";
    }
  }
  SVar3.Length = sVar2;
  SVar3.Data = pcVar1;
  return SVar3;
}

Assistant:

StringRef llvm::dwarf::OperationEncodingString(unsigned Encoding) {
  switch (Encoding) {
  default:
    return StringRef();
#define HANDLE_DW_OP(ID, NAME, VERSION, VENDOR)                                \
  case DW_OP_##NAME:                                                           \
    return "DW_OP_" #NAME;
#include "llvm/BinaryFormat/Dwarf.def"
  case DW_OP_LLVM_convert:
    return "DW_OP_LLVM_convert";
  case DW_OP_LLVM_fragment:
    return "DW_OP_LLVM_fragment";
  case DW_OP_LLVM_tag_offset:
    return "DW_OP_LLVM_tag_offset";
  case DW_OP_LLVM_entry_value:
    return "DW_OP_LLVM_entry_value";
  }
}